

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos)

{
  ImDrawList *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  float radius;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImU32 local_70;
  float local_6c;
  ImU32 cross_col;
  float cross_extent;
  ImVec2 center;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  bool is_clipped;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  undefined1 local_38 [8];
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *pos_local;
  ImGuiID id_local;
  
  pIVar2 = GImGui;
  bb.Max = (ImVec2)GImGui->CurrentWindow;
  ImVec2::ImVec2(&local_50,GImGui->FontSize,GImGui->FontSize);
  local_48 = operator+(pos,&local_50);
  _col = ::operator*(&(pIVar2->Style).FramePadding,2.0);
  local_40 = operator+(&local_48,(ImVec2 *)&col);
  ImRect::ImRect((ImRect *)local_38,pos,&local_40);
  bVar3 = ItemAdd((ImRect *)local_38,id,(ImRect *)0x0);
  center.y._3_1_ = (bVar3 ^ 0xffU) & 1;
  center.y._0_1_ =
       ButtonBehavior((ImRect *)local_38,id,(bool *)((long)&center.y + 2),
                      (bool *)((long)&center.y + 1),0);
  pos_local._7_1_ = (bool)center.y._0_1_;
  if ((center.y._3_1_ & 1) == 0) {
    center.x = (float)GetColorU32(center.y._1_1_ & 1 | 0x16,1.0);
    _cross_col = ImRect::GetCenter((ImRect *)local_38);
    if ((center.y._2_1_ & 1) != 0) {
      pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b8);
      radius = ImMax<float>(2.0,pIVar2->FontSize * 0.5 + 1.0);
      ImDrawList::AddCircleFilled(pIVar1,(ImVec2 *)&cross_col,radius,(ImU32)center.x,0xc);
    }
    local_6c = pIVar2->FontSize * 0.5 * 0.7071 + -1.0;
    local_70 = GetColorU32(0,1.0);
    ImVec2::ImVec2(&local_78,0.5,0.5);
    operator-=((ImVec2 *)&cross_col,&local_78);
    pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b8);
    ImVec2::ImVec2(&local_88,local_6c,local_6c);
    local_80 = operator+((ImVec2 *)&cross_col,&local_88);
    ImVec2::ImVec2(&local_98,-local_6c,-local_6c);
    local_90 = operator+((ImVec2 *)&cross_col,&local_98);
    ImDrawList::AddLine(pIVar1,&local_80,&local_90,local_70,1.0);
    pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b8);
    ImVec2::ImVec2(&local_a8,local_6c,-local_6c);
    local_a0 = operator+((ImVec2 *)&cross_col,&local_a8);
    ImVec2::ImVec2(&local_b8,-local_6c,local_6c);
    local_b0 = operator+((ImVec2 *)&cross_col,&local_b8);
    ImDrawList::AddLine(pIVar1,&local_a0,&local_b0,local_70,1.0);
    pos_local._7_1_ = (bool)(center.y._0_1_ & 1);
  }
  return pos_local._7_1_;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos)//, float size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We intentionally allow interaction when clipped so that a mechanical Alt,Right,Validate sequence close a window.
    // (this isn't the regular behavior of buttons, but it doesn't affect the user much because navigation tends to keep items visible).
    const ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    bool is_clipped = !ItemAdd(bb, id);

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    if (is_clipped)
        return pressed;

    // Render
    ImU32 col = GetColorU32(held ? ImGuiCol_ButtonActive : ImGuiCol_ButtonHovered);
    ImVec2 center = bb.GetCenter();
    if (hovered)
        window->DrawList->AddCircleFilled(center, ImMax(2.0f, g.FontSize * 0.5f + 1.0f), col, 12);

    float cross_extent = g.FontSize * 0.5f * 0.7071f - 1.0f;
    ImU32 cross_col = GetColorU32(ImGuiCol_Text);
    center -= ImVec2(0.5f, 0.5f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,+cross_extent), center + ImVec2(-cross_extent,-cross_extent), cross_col, 1.0f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,-cross_extent), center + ImVec2(-cross_extent,+cross_extent), cross_col, 1.0f);

    return pressed;
}